

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

char * mctools_basename_view(mcu8str *path)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  mcu8str *in_RDI;
  bool bVar5;
  char *it;
  char *itE;
  char *itB;
  mcu8str *in_stack_ffffffffffffffd8;
  char *local_18;
  char *local_8;
  
  local_18 = in_RDI->c_str;
  pcVar4 = in_RDI->c_str + in_RDI->size;
  iVar3 = mctools_impl_has_winnamespace(in_RDI);
  if (iVar3 != 0) {
    local_18 = local_18 + 4;
  }
  cVar2 = mctools_drive_letter(in_stack_ffffffffffffffd8);
  if (cVar2 != '\0') {
    local_18 = local_18 + 2;
  }
  local_8 = pcVar4;
  if (local_18 != pcVar4) {
    do {
      pcVar1 = local_8;
      local_8 = pcVar1 + -1;
      bVar5 = false;
      if ((local_18 < local_8) && (bVar5 = false, *local_8 != '/')) {
        bVar5 = *local_8 != '\\';
      }
    } while (bVar5);
    if ((*local_8 == '/') || (*local_8 == '\\')) {
      local_8 = pcVar1;
    }
    if ((local_8 + 1 == pcVar4) && (*local_8 == '.')) {
      local_8 = pcVar4;
    }
  }
  return local_8;
}

Assistant:

const char * mctools_basename_view( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;
    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter
    if ( itB == itE )
      return itE;//empty
    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    if ( it+1 == itE && *it == '.' )
      return itE;//empty
    return it;
  }